

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::
CmpHelperEQ<int,iutest::detail::peep::Peep<test::prod_test::ProdClass,test::prod_test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::peep_member_object_impl<test::prod_test::ProdClass,int,false>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,int *expected,
          peep_member_object_impl<test::prod_test::ProdClass,_int,_false> *actual)

{
  int *actual_expression;
  char *expected_expression;
  bool bVar1;
  string local_70;
  string local_50;
  internal *local_30;
  peep_member_object_impl<test::prod_test::ProdClass,_int,_false> *actual_local;
  int *expected_local;
  char *actual_str_local;
  char *expected_str_local;
  
  local_30 = (internal *)expected;
  actual_local = (peep_member_object_impl<test::prod_test::ProdClass,_int,_false> *)actual_str;
  expected_local = (int *)expected_str;
  actual_str_local = (char *)this;
  expected_str_local = (char *)__return_storage_ptr__;
  bVar1 = iuOperatorEQ<iutest::detail::peep::Peep<test::prod_test::ProdClass,test::prod_test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::peep_member_object_impl<test::prod_test::ProdClass,int,false>,int>
                    ((peep_member_object_impl<test::prod_test::ProdClass,_int,_false> *)expected,
                     (int *)actual_str);
  expected_expression = actual_str_local;
  actual_expression = expected_local;
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    FormatForComparisonFailureMessage<int,iutest::detail::peep::Peep<test::prod_test::ProdClass,test::prod_test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::peep_member_object_impl<test::prod_test::ProdClass,int,false>>
              (&local_50,(internal *)actual_local,(int *)local_30,
               (peep_member_object_impl<test::prod_test::ProdClass,_int,_false> *)actual_str);
    FormatForComparisonFailureMessage<iutest::detail::peep::Peep<test::prod_test::ProdClass,test::prod_test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::peep_member_object_impl<test::prod_test::ProdClass,int,false>,int>
              (&local_70,local_30,actual_local,(int *)actual_str);
    EqFailure(__return_storage_ptr__,expected_expression,(char *)actual_expression,&local_50,
              &local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }